

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPile.cpp
# Opt level: O0

unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
 __thiscall solitaire::piles::FoundationPile::createSnapshot(FoundationPile *this)

{
  undefined1 local_30 [32];
  FoundationPile *this_local;
  
  this_local = this;
  std::enable_shared_from_this<solitaire::piles::FoundationPile>::shared_from_this
            ((enable_shared_from_this<solitaire::piles::FoundationPile> *)local_30);
  std::
  make_unique<solitaire::piles::FoundationPile::Snapshot,std::shared_ptr<solitaire::piles::FoundationPile>,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>
            ((shared_ptr<solitaire::piles::FoundationPile> *)(local_30 + 0x10),
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_30);
  std::
  unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>
  ::
  unique_ptr<solitaire::piles::FoundationPile::Snapshot,std::default_delete<solitaire::piles::FoundationPile::Snapshot>,void>
            ((unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>
              *)this,(unique_ptr<solitaire::piles::FoundationPile::Snapshot,_std::default_delete<solitaire::piles::FoundationPile::Snapshot>_>
                      *)(local_30 + 0x10));
  std::
  unique_ptr<solitaire::piles::FoundationPile::Snapshot,_std::default_delete<solitaire::piles::FoundationPile::Snapshot>_>
  ::~unique_ptr((unique_ptr<solitaire::piles::FoundationPile::Snapshot,_std::default_delete<solitaire::piles::FoundationPile::Snapshot>_>
                 *)(local_30 + 0x10));
  std::shared_ptr<solitaire::piles::FoundationPile>::~shared_ptr
            ((shared_ptr<solitaire::piles::FoundationPile> *)local_30);
  return (__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
          )(__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<archivers::interfaces::Snapshot> FoundationPile::createSnapshot() {
    return std::make_unique<Snapshot>(shared_from_this(), cards);
}